

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O1

void Abc_SclUpdateLoad(SC_Man *p,Abc_Obj_t *pObj,SC_Cell *pOld,SC_Cell *pNew)

{
  uint uVar1;
  int *piVar2;
  void **ppvVar3;
  SC_Pair *pSVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar7 = (ulong)(pObj->vFanins).nSize;
  if (0 < (long)uVar7) {
    piVar2 = (pObj->vFanins).pArray;
    ppvVar3 = pObj->pNtk->vObjs->pArray;
    pSVar4 = p->pLoads;
    uVar1 = (pOld->vPins).nSize;
    uVar9 = 0;
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar8 = uVar9;
    }
    do {
      if ((uVar8 == uVar9) || ((long)(pNew->vPins).nSize <= (long)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar1 = *(uint *)((long)ppvVar3[piVar2[uVar9]] + 0x10);
      pvVar5 = (pOld->vPins).pArray[uVar9];
      pvVar6 = (pNew->vPins).pArray[uVar9];
      pSVar4[uVar1].rise =
           (*(float *)((long)pvVar6 + 0x10) - *(float *)((long)pvVar5 + 0x10)) + pSVar4[uVar1].rise;
      pSVar4[uVar1].fall =
           (*(float *)((long)pvVar6 + 0x14) - *(float *)((long)pvVar5 + 0x14)) + pSVar4[uVar1].fall;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  return;
}

Assistant:

void Abc_SclUpdateLoad( SC_Man * p, Abc_Obj_t * pObj, SC_Cell * pOld, SC_Cell * pNew )
{
    Abc_Obj_t * pFanin;
    int k;
    Abc_ObjForEachFanin( pObj, pFanin, k )
    {
        SC_Pair * pLoad = Abc_SclObjLoad( p, pFanin );
        SC_Pin * pPinOld = SC_CellPin( pOld, k );
        SC_Pin * pPinNew = SC_CellPin( pNew, k );
        pLoad->rise += pPinNew->rise_cap - pPinOld->rise_cap;
        pLoad->fall += pPinNew->fall_cap - pPinOld->fall_cap;
    }
}